

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_loadfile(HSQUIRRELVM v,SQChar *filename,SQBool printerror)

{
  SQFILE pvVar1;
  SQRESULT SVar2;
  HSQUIRRELVM in_RDI;
  SQRESULT r;
  SQChar *buffer;
  SQInteger size;
  SQFILE file;
  SQChar *in_stack_ffffffffffffffb8;
  HSQUIRRELVM in_stack_ffffffffffffffc0;
  SQFILE in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  pvVar1 = sqstd_fopen((SQChar *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (pvVar1 == (SQFILE)0x0) {
    local_8 = (SQAllocContext)sq_throwerror(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    readFileData((HSQUIRRELVM)0x0,in_stack_ffffffffffffffc8,(SQInteger *)in_stack_ffffffffffffffc0);
    local_8 = (SQAllocContext)0xffffffffffffffff;
    SVar2 = sq_compile(v,filename,printerror,(SQChar *)file,size,(HSQOBJECT *)buffer);
    if (-1 < SVar2) {
      local_8 = (SQAllocContext)0x0;
    }
    sq_getallocctx(in_RDI);
    sq_free(local_8,in_stack_ffffffffffffffb8,0x1d1b2e);
    sqstd_fclose((SQFILE)0x1d1b38);
  }
  return (SQRESULT)local_8;
}

Assistant:

SQRESULT sqstd_loadfile(HSQUIRRELVM v,const SQChar *filename,SQBool printerror)
{
    SQFILE file = sqstd_fopen(filename,_SC("rb"));

    if(file){
        SQInteger size = 0;
        SQChar *buffer = readFileData(v, file, size);
        SQRESULT r = SQ_ERROR;

        if(SQ_SUCCEEDED(sq_compile(v,buffer,size,filename,printerror))){
            r = SQ_OK;
        }
        sq_free(sq_getallocctx(v), buffer, size);
        sqstd_fclose(file);
        return r;
    }
    return sq_throwerror(v,_SC("cannot open the file"));
}